

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::callPassThrough
          (TestMembraneImpl *this,CallPassThroughContext context)

{
  CapTableReader *pCVar1;
  CapTableBuilder *pCVar2;
  WirePointer *pWVar3;
  undefined8 uVar4;
  Disposer *pDVar5;
  RequestHook *pRVar6;
  int iVar7;
  TransformPromiseNodeBase *this_00;
  size_t in_RCX;
  _func_int **in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *extraout_RDX_04;
  PromiseNode *extraout_RDX_05;
  PromiseNode *pPVar8;
  PromiseNode *extraout_RDX_06;
  int in_R8D;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Promise<void> PVar12;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  req;
  Reader params;
  undefined1 local_110 [16];
  CapTableReader *pCStack_100;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_f8;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_b8;
  StructReader local_78;
  undefined1 local_48 [16];
  Maybe<capnp::MessageSize> local_38;
  
  (**(code **)*in_RDX)(&local_f8);
  local_b8.super_Builder._builder.data = local_f8.super_Builder._builder.data;
  local_b8.super_Builder._builder.pointers = local_f8.super_Builder._builder.pointers;
  local_b8.super_Builder._builder.capTable = local_f8.super_Builder._builder.capTable;
  PointerReader::getStruct(&local_78,(PointerReader *)&local_b8,(word *)0x0);
  bVar9 = local_78.pointerCount != 0;
  local_f8.super_Builder._builder.data = (WirePointer *)0x0;
  if (bVar9) {
    local_f8.super_Builder._builder.data = local_78.pointers;
  }
  iVar7 = 0x7fffffff;
  if (bVar9) {
    iVar7 = local_78.nestingLimit;
  }
  local_f8.super_Builder._builder.segment._0_4_ = 0;
  local_f8.super_Builder._builder.segment._4_4_ = 0;
  uVar10 = 0;
  uVar11 = 0;
  if (bVar9) {
    local_f8.super_Builder._builder.segment._0_4_ = local_78.segment._0_4_;
    local_f8.super_Builder._builder.segment._4_4_ = local_78.segment._4_4_;
    uVar10 = local_78.capTable._0_4_;
    uVar11 = local_78.capTable._4_4_;
  }
  local_f8.super_Builder._builder.capTable = (CapTableBuilder *)CONCAT44(uVar11,uVar10);
  local_f8.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_f8.super_Builder._builder.pointers._4_4_,iVar7);
  PointerReader::getCapability((PointerReader *)local_48);
  local_110._8_8_ = local_48._0_8_;
  pCStack_100 = (CapTableReader *)local_48._8_8_;
  local_110._0_8_ = &capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Thing::Client::passThroughRequest
            (&local_b8,(Client *)local_110,&local_38);
  pCVar1 = pCStack_100;
  __buf = extraout_RDX;
  if (pCStack_100 != (CapTableReader *)0x0) {
    pCStack_100 = (CapTableReader *)0x0;
    (*(code *)(*(Arena **)local_110._8_8_)->_vptr_Arena)
              (local_110._8_8_,
               pCVar1->_vptr_CapTableReader[-2] + (long)&pCVar1->_vptr_CapTableReader);
    __buf = extraout_RDX_00;
  }
  if ((local_78.dataSize == 0) || ((*local_78.data & 1) == 0)) {
    Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
    ::send(&local_f8,(int)&local_b8,__buf,in_RCX,in_R8D);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&local_f8,
               kj::_::
               TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:68:11),_kj::_::PropagateException>
               ::anon_class_8_1_bc11688f_for_func::operator());
    pDVar5 = local_f8.hook.disposer;
    uVar4 = local_f8.super_Builder._builder._32_8_;
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060aaa8;
    this_00[1].super_PromiseNode._vptr_PromiseNode = in_RDX;
    (this->super_Server)._vptr_Server =
         (_func_int **)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,capnp::_::(anonymous_namespace)::TestMembraneImpl::callPassThrough(capnp::CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>)::{lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>&&)#1},kj::_::PropagateException>>
          ::instance;
    *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
    pPVar8 = extraout_RDX_01;
    if (local_f8.super_Builder._builder._32_8_ != 0) {
      local_f8.super_Builder._builder.dataSize = 0;
      local_f8.super_Builder._builder.pointerCount = 0;
      local_f8.super_Builder._builder._38_2_ = 0;
      local_f8.hook.disposer = (Disposer *)0x0;
      (**(local_f8.hook.ptr)->_vptr_RequestHook)(local_f8.hook.ptr,uVar4,8,pDVar5,pDVar5,0);
      pPVar8 = extraout_RDX_02;
    }
    pWVar3 = local_f8.super_Builder._builder.pointers;
    if (local_f8.super_Builder._builder.pointers != (WirePointer *)0x0) {
      local_f8.super_Builder._builder.pointers = (WirePointer *)0x0;
      (**(code **)*local_f8.super_Builder._builder.data)
                (local_f8.super_Builder._builder.data,
                 (long)&(pWVar3->offsetAndKind).value + *(long *)((long)*pWVar3 + -0x10));
      pPVar8 = extraout_RDX_03;
    }
    pCVar2 = local_f8.super_Builder._builder.capTable;
    if (local_f8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
      local_f8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_f8.super_Builder._builder.segment._4_4_,
                           local_f8.super_Builder._builder.segment._0_4_))
                ((undefined8 *)
                 CONCAT44(local_f8.super_Builder._builder.segment._4_4_,
                          local_f8.super_Builder._builder.segment._0_4_),
                 (pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
                 (long)&(pCVar2->super_CapTableReader)._vptr_CapTableReader);
      pPVar8 = extraout_RDX_04;
    }
  }
  else {
    (**(code **)(*in_RDX + 0x18))(this);
    pPVar8 = extraout_RDX_05;
  }
  pRVar6 = local_b8.hook.ptr;
  if (local_b8.hook.ptr != (RequestHook *)0x0) {
    local_b8.hook.ptr = (RequestHook *)0x0;
    (**(local_b8.hook.disposer)->_vptr_Disposer)
              (local_b8.hook.disposer,
               pRVar6->_vptr_RequestHook[-2] + (long)&pRVar6->_vptr_RequestHook);
    pPVar8 = extraout_RDX_06;
  }
  PVar12.super_PromiseBase.node.ptr = pPVar8;
  PVar12.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar12.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> callPassThrough(CallPassThroughContext context) override {
    auto params = context.getParams();
    auto req = params.getThing().passThroughRequest();
    if (params.getTailCall()) {
      return context.tailCall(kj::mv(req));
    } else {
      return req.send().then(
          [KJ_CPCAP(context)](Response<test::TestMembrane::Result>&& result) mutable {
        context.setResults(result);
      });
    }